

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variablesio.cpp
# Opt level: O2

void __thiscall
bal::VariableTextReader::read_variable_element_hex_
          (VariableTextReader *this,Container<unsigned_int> *value)

{
  char cVar1;
  ulong uVar2;
  _func_int *p_Var3;
  long lVar4;
  long lVar5;
  int i;
  ulong uVar6;
  byte bVar7;
  uint *puVar8;
  allocator local_5d;
  container_size_t local_5c;
  Container<unsigned_int> *local_58;
  string local_50;
  
  uVar2 = *(ulong *)(&this->field_0x10 + (long)this->_vptr_VariableTextReader[-3]);
  if (uVar2 - 3 >> 2 < 0x3fffffff) {
    local_5c = (int)uVar2 * 4 - 8;
    local_58 = value;
    Container<unsigned_int>::reserve(value,local_5c);
    p_Var3 = this->_vptr_VariableTextReader[-3];
    lVar4 = *(long *)(&this->field_0x8 + (long)p_Var3);
    lVar5 = *(long *)(&this->field_0x18 + (long)p_Var3);
    puVar8 = local_58->data_ + local_58->size_;
    if (*(char *)(lVar5 + lVar4) == '-') {
      std::__cxx11::string::string
                ((string *)&local_50,"Negative hexadecimal values not supported",&local_5d);
      TextReader::parse_error
                ((TextReader *)((long)&this->_vptr_VariableTextReader + (long)p_Var3),&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    for (uVar6 = 2; uVar6 < uVar2; uVar6 = uVar6 + 1) {
      cVar1 = *(char *)(lVar5 + lVar4 + uVar6);
      if (cVar1 < 'A') {
        bVar7 = cVar1 - 0x30;
      }
      else {
        bVar7 = cVar1 + 0xa9;
      }
      *puVar8 = bVar7 >> 3 & 1;
      puVar8[1] = bVar7 >> 2 & 1;
      puVar8[2] = bVar7 >> 1 & 1;
      puVar8[3] = bVar7 & 1;
      puVar8 = puVar8 + 4;
    }
    local_58->size_ = local_58->size_ + local_5c;
    p_Var3 = this->_vptr_VariableTextReader[-3];
    *(long *)(&this->field_0x8 + (long)p_Var3) =
         *(long *)(&this->field_0x8 + (long)p_Var3) + *(long *)(&this->field_0x10 + (long)p_Var3);
    *(undefined8 *)(&this->field_0x10 + (long)p_Var3) = 0;
    *(undefined4 *)(&this->field_0x40 + (long)p_Var3) = 0;
    return;
  }
  __assert_fail("token_len > 2 && token_len <= CONTAINER_SIZE_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/variables/variablesio.cpp"
                ,0xad,
                "void bal::VariableTextReader::read_variable_element_hex_(Container<literalid_t> &)"
               );
}

Assistant:

inline void VariableTextReader::read_variable_element_hex_(Container<literalid_t>& value) {
        size_t token_len = get_current_token_len();
        assert(token_len > 2 && token_len <= CONTAINER_SIZE_MAX); // prefix
        const container_size_t value_size = ((container_size_t)token_len - 2) << 2;
        value.reserve(value_size);
        
        literalid_t* p_current = value.data_ + value.size_;
        const char* const token = get_current_token();
        
        if (token[0] == '-') {
            parse_error("Negative hexadecimal values not supported");
        };
        
        for (auto i = 2; i < token_len; i++) {
            char h = _hex_value(token[i]);
            p_current[0] = literal_t__constant(h & 0b1000);
            p_current[1] = literal_t__constant(h & 0b0100);
            p_current[2] = literal_t__constant(h & 0b0010);
            p_current[3] = literal_t__constant(h & 0b0001);
            p_current += 4;
        };
        
        value.size_ += value_size;
        skip_token();
    }